

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inject_sleigh.cc
# Opt level: O3

int4 __thiscall
PcodeInjectLibrarySleigh::manualCallOtherFixup
          (PcodeInjectLibrarySleigh *this,string *name,string *outname,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *inname,string *snippet)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  InjectPayload *this_00;
  long lVar2;
  pointer pcVar3;
  PcodeInjectLibrarySleigh *pPVar4;
  uint uVar5;
  long *plVar6;
  pointer pbVar7;
  long *plVar8;
  long lVar9;
  ulong uVar10;
  string sourceName;
  InjectParameter local_90;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  string *local_48;
  PcodeInjectLibrarySleigh *local_40;
  string *local_38;
  
  local_38 = outname;
  std::operator+(&local_90.name,"<manual callotherfixup name=\"",name);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_90);
  local_68 = &local_58;
  plVar8 = plVar6 + 2;
  if ((long *)*plVar6 == plVar8) {
    local_58 = *plVar8;
    lStack_50 = plVar6[3];
  }
  else {
    local_58 = *plVar8;
    local_68 = (long *)*plVar6;
  }
  local_60 = plVar6[1];
  *plVar6 = (long)plVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  paVar1 = &local_90.name.field_2;
  local_48 = snippet;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_90.name._M_dataplus._M_p);
  }
  uVar5 = (**(this->super_PcodeInjectLibrary)._vptr_PcodeInjectLibrary)(this,&local_68,name,2);
  this_00 = (this->super_PcodeInjectLibrary).injection.
            super__Vector_base<InjectPayload_*,_std::allocator<InjectPayload_*>_>._M_impl.
            super__Vector_impl_data._M_start[(int)uVar5];
  pbVar7 = (inname->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_40 = this;
  if ((inname->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pbVar7) {
    lVar9 = 8;
    uVar10 = 0;
    do {
      lVar2 = *(long *)((long)pbVar7 + lVar9 + -8);
      local_90.name._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,lVar2,
                 *(long *)((long)&(pbVar7->_M_dataplus)._M_p + lVar9) + lVar2);
      local_90.index = 0;
      local_90.size = 0;
      std::vector<InjectParameter,_std::allocator<InjectParameter>_>::emplace_back<InjectParameter>
                (&this_00->inputlist,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90.name._M_dataplus._M_p != paVar1) {
        operator_delete(local_90.name._M_dataplus._M_p);
      }
      uVar10 = uVar10 + 1;
      pbVar7 = (inname->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar9 = lVar9 + 0x20;
    } while (uVar10 < (ulong)((long)(inname->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7 >> 5)
            );
  }
  if (local_38->_M_string_length != 0) {
    pcVar3 = (local_38->_M_dataplus)._M_p;
    local_90.name._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar3,pcVar3 + local_38->_M_string_length);
    local_90.index = 0;
    local_90.size = 0;
    std::vector<InjectParameter,_std::allocator<InjectParameter>_>::emplace_back<InjectParameter>
              (&this_00->output,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.name._M_dataplus._M_p != paVar1) {
      operator_delete(local_90.name._M_dataplus._M_p);
    }
  }
  InjectPayload::orderParameters(this_00);
  pPVar4 = local_40;
  std::__cxx11::string::_M_assign((string *)&this_00[1].name);
  (*(pPVar4->super_PcodeInjectLibrary)._vptr_PcodeInjectLibrary[1])(pPVar4,(ulong)uVar5);
  if (local_68 != &local_58) {
    operator_delete(local_68);
  }
  return uVar5;
}

Assistant:

int4 PcodeInjectLibrarySleigh::manualCallOtherFixup(const string &name,const string &outname,
						    const vector<string> &inname,const string &snippet)
{
  string sourceName = "<manual callotherfixup name=\"" + name + "\")";
  int4 injectid = allocateInject(sourceName, name, InjectPayload::CALLOTHERFIXUP_TYPE);
  InjectPayloadSleigh *payload = (InjectPayloadSleigh *)getPayload(injectid);
  for(int4 i=0;i<inname.size();++i)
    payload->inputlist.push_back(InjectParameter(inname[i],0));
  if (outname.size() != 0)
    payload->output.push_back(InjectParameter(outname,0));
  payload->orderParameters();
  payload->parsestring = snippet;
  registerInject(injectid);
  return injectid;
}